

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllNetworks(Registry *this,NetworkArray *aRet)

{
  PersistentStorage *pPVar1;
  int iVar2;
  Status SVar3;
  Network NStack_78;
  
  pPVar1 = this->mStorage;
  Network::Network(&NStack_78);
  iVar2 = (*pPVar1->_vptr_PersistentStorage[0x16])(pPVar1,&NStack_78,aRet);
  SVar3 = kNotFound;
  if ((char)iVar2 != '\x01') {
    SVar3 = ((char)iVar2 != '\0') << 2;
  }
  Network::~Network(&NStack_78);
  return SVar3;
}

Assistant:

Registry::Status Registry::GetAllNetworks(NetworkArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Network{}, aRet));

    return status;
}